

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectoriesConstraint::cmOrderDirectoriesConstraint
          (cmOrderDirectoriesConstraint *this,cmOrderDirectories *od,string *file)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  string local_70;
  string local_50;
  
  this->_vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraint_007a6328;
  this->OD = od;
  this->GlobalGenerator = od->GlobalGenerator;
  (this->FullPath)._M_dataplus._M_p = (pointer)&(this->FullPath).field_2;
  (this->FullPath)._M_string_length = 0;
  (this->FullPath).field_2._M_local_buf[0] = '\0';
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  (this->FileName)._M_string_length = 0;
  (this->FileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->FullPath);
  lVar4 = std::__cxx11::string::rfind((char *)file,0x59364d);
  if (lVar4 != -1) {
    if (cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)::
        splitFramework == '\0') {
      iVar3 = __cxa_guard_acquire(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                                   ::splitFramework);
      if (iVar3 != 0) {
        cmsys::RegularExpression::RegularExpression
                  (&cmOrderDirectoriesConstraint::splitFramework,"^(.*)/(.*).framework/(.*)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &cmOrderDirectoriesConstraint::splitFramework,&__dso_handle);
        __cxa_guard_release(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                             ::splitFramework);
      }
    }
    bVar2 = cmsys::RegularExpression::find(&cmOrderDirectoriesConstraint::splitFramework,file);
    if (bVar2) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_70,&cmOrderDirectoriesConstraint::splitFramework.regmatch,3);
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_50,&cmOrderDirectoriesConstraint::splitFramework.regmatch,2);
      lVar4 = std::__cxx11::string::find((string *)&local_70,(ulong)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (lVar4 != -1) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_70,&cmOrderDirectoriesConstraint::splitFramework.regmatch,1);
        std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pcVar1 = (file->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_70,pcVar1 + (this->Directory)._M_string_length + 1,
                   pcVar1 + file->_M_string_length);
        std::__cxx11::string::operator=((string *)&this->FileName,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  if ((this->FileName)._M_string_length == 0) {
    cmsys::SystemTools::GetFilenamePath(&local_70,file);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmsys::SystemTools::GetFilenameName(&local_70,file);
    std::__cxx11::string::operator=((string *)&this->FileName,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

cmOrderDirectoriesConstraint(cmOrderDirectories* od, std::string const& file)
    : OD(od)
    , GlobalGenerator(od->GlobalGenerator)
  {
    this->FullPath = file;

    if (file.rfind(".framework") != std::string::npos) {
      static cmsys::RegularExpression splitFramework(
        "^(.*)/(.*).framework/(.*)$");
      if (splitFramework.find(file) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2)))) {
        this->Directory = splitFramework.match(1);
        this->FileName =
          std::string(file.begin() + this->Directory.size() + 1, file.end());
      }
    }

    if (this->FileName.empty()) {
      this->Directory = cmSystemTools::GetFilenamePath(file);
      this->FileName = cmSystemTools::GetFilenameName(file);
    }
  }